

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

Mat * ncnn::Mat::from_pixels(uchar *pixels,int type,int w,int h,Allocator *allocator)

{
  uint uVar1;
  uint in_EDX;
  Mat *in_RDI;
  uchar *unaff_retaddr;
  int type_from;
  Allocator *in_stack_00000060;
  int stride;
  int h_00;
  int w_00;
  undefined8 in_stack_fffffffffffffff8;
  int type_00;
  
  uVar1 = in_EDX & 0xffff;
  h_00 = (int)((ulong)in_RDI >> 0x20);
  w_00 = (int)in_stack_fffffffffffffff8;
  type_00 = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  stride = (int)in_RDI;
  if ((uVar1 == 1) || (uVar1 == 2)) {
    from_pixels(unaff_retaddr,type_00,w_00,h_00,stride,in_stack_00000060);
  }
  else if (uVar1 == 3) {
    from_pixels(unaff_retaddr,type_00,w_00,h_00,stride,in_stack_00000060);
  }
  else if ((uVar1 == 4) || (uVar1 == 5)) {
    from_pixels(unaff_retaddr,type_00,w_00,h_00,stride,in_stack_00000060);
  }
  else {
    fprintf(_stderr,"unknown convert type %d",(ulong)in_EDX);
    fprintf(_stderr,"\n");
    in_RDI->data = (void *)0x0;
    in_RDI->refcount = (int *)0x0;
    in_RDI->elemsize = 0;
    in_RDI->elempack = 0;
    in_RDI->allocator = (Allocator *)0x0;
    in_RDI->dims = 0;
    in_RDI->w = 0;
    in_RDI->h = 0;
    in_RDI->d = 0;
    in_RDI->c = 0;
    in_RDI->cstep = 0;
  }
  return in_RDI;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, Allocator* allocator)
{
    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        return Mat::from_pixels(pixels, type, w, h, w * 3, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        return Mat::from_pixels(pixels, type, w, h, w * 1, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        return Mat::from_pixels(pixels, type, w, h, w * 4, allocator);
    }

    // unknown convert type
    NCNN_LOGE("unknown convert type %d", type);
    return Mat();
}